

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::add_child
          (tag_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *tag)

{
  bool bVar1;
  undefined8 uVar2;
  exception_t<cfgfile::string_trait_t> *this_00;
  string_t *__rhs;
  tag_t<cfgfile::string_trait_t> *in_RSI;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  in_RDI;
  string *in_stack_fffffffffffffdf8;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  allocator *__lhs;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  in_stack_fffffffffffffe10;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  in_stack_fffffffffffffe18;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  allocator local_199;
  string local_198 [71];
  allocator local_151;
  string local_150 [87];
  allocator local_f9;
  string local_f8 [192];
  tag_t<cfgfile::string_trait_t> **local_38;
  tag_t<cfgfile::string_trait_t> *local_30;
  tag_t<cfgfile::string_trait_t> **local_28;
  tag_t<cfgfile::string_trait_t> **local_20;
  tag_t<cfgfile::string_trait_t> **local_18;
  tag_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  local_20 = (tag_t<cfgfile::string_trait_t> **)
             std::
             vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
             ::cbegin((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                       *)in_stack_fffffffffffffdf8);
  local_28 = (tag_t<cfgfile::string_trait_t> **)
             std::
             vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
             ::cend((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     *)in_stack_fffffffffffffdf8);
  local_30 = local_10;
  local_18 = (tag_t<cfgfile::string_trait_t> **)
             std::
             find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,cfgfile::tag_t<cfgfile::string_trait_t>::add_child(cfgfile::tag_t<cfgfile::string_trait_t>&)::_lambda(cfgfile::tag_t<cfgfile::string_trait_t>const*)_1_>
                       (in_RDI,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18._M_current);
  local_38 = (tag_t<cfgfile::string_trait_t> **)
             std::
             vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
             ::cend((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     *)in_stack_fffffffffffffdf8);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                      *)in_stack_fffffffffffffe00,
                     (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                      *)in_stack_fffffffffffffdf8);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x30);
    paVar3 = &local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Tag with name \"",paVar3);
    string_trait_t::from_ascii(in_stack_fffffffffffffdf8);
    this_00 = (exception_t<cfgfile::string_trait_t> *)name_abi_cxx11_(local_10);
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    __lhs = &local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"\" already exists in parent tag \"",__lhs);
    string_trait_t::from_ascii(in_stack_fffffffffffffdf8);
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    __rhs = name_abi_cxx11_((tag_t<cfgfile::string_trait_t> *)in_RDI._M_current);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs)
    ;
    paVar3 = &local_199;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"\".",paVar3);
    string_trait_t::from_ascii((string *)paVar3);
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,(string_t *)__lhs);
    __cxa_throw(uVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  std::
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ::cbegin((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            *)in_stack_fffffffffffffdf8);
  std::
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ::cend((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
          *)in_stack_fffffffffffffdf8);
  std::
  find<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,cfgfile::tag_t<cfgfile::string_trait_t>*>
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             (tag_t<cfgfile::string_trait_t> **)in_stack_fffffffffffffe08);
  std::
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ::cend((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
          *)in_stack_fffffffffffffdf8);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                      *)in_stack_fffffffffffffe00,
                     (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                      *)in_stack_fffffffffffffdf8);
  if (bVar1) {
    std::
    vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
    ::push_back((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                 *)in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
    set_parent(local_10,(tag_t<cfgfile::string_trait_t> *)in_RDI._M_current);
  }
  return;
}

Assistant:

void add_child( tag_t< Trait > & tag )
	{
		if( std::find_if( m_child_tags.cbegin(), m_child_tags.cend(),
			[ &tag ] ( const tag_t< Trait > * t )
			{
				return ( tag.name() == t->name() );
			} ) != m_child_tags.cend() )
		{
			throw exception_t< Trait > (
				Trait::from_ascii( "Tag with name \"" ) +
				tag.name() +
				Trait::from_ascii( "\" already exists in parent tag \"" ) +
				this->name() +
				Trait::from_ascii( "\"." ) );
		}

		if( std::find( m_child_tags.cbegin(), m_child_tags.cend(), &tag ) ==
			m_child_tags.cend() )
		{
			m_child_tags.push_back( &tag );

			tag.set_parent( this );
		}
	}